

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall absl::lts_20250127::synchronization_internal::GraphCycles::Rep::Rep(Rep *this)

{
  Rep *this_local;
  
  synchronization_internal::anon_unknown_0::
  Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::Vec
            (&this->nodes_);
  synchronization_internal::anon_unknown_0::Vec<int>::Vec(&this->free_nodes_);
  synchronization_internal::anon_unknown_0::PointerMap::PointerMap(&this->ptrmap_,&this->nodes_);
  synchronization_internal::anon_unknown_0::Vec<int>::Vec(&this->deltaf_);
  synchronization_internal::anon_unknown_0::Vec<int>::Vec(&this->deltab_);
  synchronization_internal::anon_unknown_0::Vec<int>::Vec(&this->list_);
  synchronization_internal::anon_unknown_0::Vec<int>::Vec(&this->merged_);
  synchronization_internal::anon_unknown_0::Vec<int>::Vec(&this->stack_);
  return;
}

Assistant:

Rep() : ptrmap_(&nodes_) {}